

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test2::testEnd(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 uVar3;
  undefined4 extraout_var;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar4;
  long lVar2;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (shader_stage - GEOMETRY_SHADER < 4) {
    (**(code **)(lVar2 + 0x638))();
    UNRECOVERED_JUMPTABLE = *(code **)(lVar2 + 0x40);
    uVar4 = 0x8c8e;
LAB_0092f91a:
    (*UNRECOVERED_JUMPTABLE)(uVar4,0);
    return;
  }
  if (shader_stage == COMPUTE_SHADER) {
    (**(code **)(lVar2 + 0x80))(0,0,0,0,0,0x88b9,CONCAT44(uVar3,0x8235));
  }
  else if (shader_stage == FRAGMENT_SHADER) {
    (**(code **)(lVar2 + 0x6a0))(0x8ca9,0x8ce0,0xde1,0,0);
    (**(code **)(lVar2 + 0xb8))(0xde1,0);
    UNRECOVERED_JUMPTABLE = *(code **)(lVar2 + 0x78);
    uVar4 = 0x8ca9;
    goto LAB_0092f91a;
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::testEnd(shaderStage shader_stage) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	switch (shader_stage)
	{
	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
	case VERTEX_SHADER:

		gl.endTransformFeedback();

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		break;

	case FRAGMENT_SHADER:

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0 /* texture_id */,
								0 /* level */);

		gl.bindTexture(GL_TEXTURE_2D, 0);

		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);

		break;

	case COMPUTE_SHADER:

		gl.bindImageTexture(0 /* first image unit */, 0 /* texture_id */, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32I);

		break;
	}
}